

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O1

date_t __thiscall
duckdb::VectorTryCastErrorOperator<duckdb::TryCastErrorMessage>::
Operation<duckdb::string_t,duckdb::date_t>
          (VectorTryCastErrorOperator<duckdb::TryCastErrorMessage> *this,string_t input,
          ValidityMask *mask,idx_t idx,void *dataptr)

{
  bool bVar1;
  string_t input_00;
  date_t output;
  int32_t local_4c;
  string local_48;
  
  input_00.value._0_8_ = input.value._0_8_;
  input_00.value.pointer.ptr = (char *)&local_4c;
  bVar1 = TryCastErrorMessage::Operation<duckdb::string_t,duckdb::date_t>
                    ((TryCastErrorMessage *)this,input_00,*(date_t **)(idx + 8),
                     (CastParameters *)idx);
  if (!bVar1) {
    Operation<duckdb::string_t,duckdb::date_t>();
    local_4c = (int32_t)HandleVectorCastError::Operation<duckdb::date_t>
                                  (&local_48,input.value._8_8_,(idx_t)mask,(VectorTryCastData *)idx)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  return (date_t)local_4c;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto data = reinterpret_cast<VectorTryCastData *>(dataptr);
		RESULT_TYPE output;
		if (DUCKDB_LIKELY(OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, output, data->parameters))) {
			return output;
		}
		bool has_error = data->parameters.error_message && !data->parameters.error_message->empty();
		return HandleVectorCastError::Operation<RESULT_TYPE>(
		    has_error ? *data->parameters.error_message : CastExceptionText<INPUT_TYPE, RESULT_TYPE>(input), mask, idx,
		    *data);
	}